

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O3

void ts_lexer__mark_end(TSLexer *payload)

{
  undefined8 uVar1;
  long lVar2;
  
  if ((payload[2].mark_end != (_func_void_TSLexer_ptr *)0x0) &&
     (lVar2 = (long)payload[2].mark_end * 0x18 + *(long *)(payload + 2),
     payload[1].lookahead == *(int *)(lVar2 + 0x10))) {
    uVar1 = *(undefined8 *)(lVar2 + -0x10);
    *(undefined4 *)&payload[1].get_column = *(undefined4 *)(lVar2 + -4);
    *(undefined8 *)((long)&payload[1].get_column + 4) = uVar1;
    return;
  }
  *(undefined4 *)&payload[1].is_at_included_range_start = *(undefined4 *)&payload[1].advance;
  payload[1].get_column = *(_func_uint32_t_TSLexer_ptr **)(payload + 1);
  return;
}

Assistant:

static void ts_lexer__mark_end(TSLexer *payload) {
  Lexer *self = (Lexer *)payload;
  TSRange *current_included_range = &self->included_ranges[self->current_included_range_index];
  if (self->current_included_range_index > 0 &&
      self->current_position.bytes == current_included_range->start_byte) {
    TSRange *previous_included_range = current_included_range - 1;
    self->token_end_position = (Length) {
      previous_included_range->end_byte,
      previous_included_range->end_point,
    };
  } else {
    self->token_end_position = self->current_position;
  }
}